

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O0

PAL_ERROR FILEGetSHMFileLocks(LPCSTR filename,SHMPTR *pshmFileLocks,BOOL noCreate)

{
  int iVar1;
  SHMPTR SVar2;
  bool bVar3;
  char *local_40;
  char *unix_filename;
  SHMFILELOCKS *nextFilelocksPtr;
  SHMFILELOCKS *filelocksPtr;
  SHMPTR shmPtrRet;
  PAL_ERROR palError;
  BOOL noCreate_local;
  SHMPTR *pshmFileLocks_local;
  LPCSTR filename_local;
  
  shmPtrRet._0_4_ = 0;
  SHMLock();
  filelocksPtr = (SHMFILELOCKS *)SHMGetInfo(SIID_FILE_LOCKS);
  while (filelocksPtr != (SHMFILELOCKS *)0x0) {
    if (filelocksPtr == (SHMFILELOCKS *)0x0) {
      nextFilelocksPtr = (SHMFILELOCKS *)0x0;
      bVar3 = true;
    }
    else {
      nextFilelocksPtr = (SHMFILELOCKS *)SHMPtrToPtr((SHMPTR)filelocksPtr);
      bVar3 = nextFilelocksPtr != (SHMFILELOCKS *)0x0;
    }
    if (!bVar3) {
LAB_00146f8a:
      fprintf(_stderr,"] %s %s:%d","FILEGetSHMFileLocks",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
              ,0x2c4);
      fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
      shmPtrRet._0_4_ = 0x54f;
      goto LAB_00147274;
    }
    if (nextFilelocksPtr->unix_filename == 0) {
      local_40 = (char *)0x0;
      bVar3 = true;
    }
    else {
      local_40 = (char *)SHMPtrToPtr(nextFilelocksPtr->unix_filename);
      bVar3 = local_40 != (char *)0x0;
    }
    if (!bVar3) goto LAB_00146f8a;
    if (local_40 == (char *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      shmPtrRet._0_4_ = 0x54f;
      goto LAB_00147274;
    }
    iVar1 = strcmp(local_40,filename);
    if (iVar1 == 0) {
      nextFilelocksPtr->refCount = nextFilelocksPtr->refCount + 1;
      goto LAB_00147274;
    }
    filelocksPtr = (SHMFILELOCKS *)nextFilelocksPtr->next;
  }
  filelocksPtr = (SHMFILELOCKS *)0x0;
  if (noCreate == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    filelocksPtr = (SHMFILELOCKS *)SHMalloc(0x38);
    if (filelocksPtr == (SHMFILELOCKS *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      shmPtrRet._0_4_ = 8;
    }
    else {
      if (filelocksPtr == (SHMFILELOCKS *)0x0) {
        nextFilelocksPtr = (SHMFILELOCKS *)0x0;
        bVar3 = true;
      }
      else {
        nextFilelocksPtr = (SHMFILELOCKS *)SHMPtrToPtr((SHMPTR)filelocksPtr);
        bVar3 = nextFilelocksPtr != (SHMFILELOCKS *)0x0;
      }
      if (bVar3) {
        SVar2 = SHMStrDup(filename);
        nextFilelocksPtr->unix_filename = SVar2;
        if (nextFilelocksPtr->unix_filename == 0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          shmPtrRet._0_4_ = 8;
        }
        else {
          nextFilelocksPtr->fileLockedRgns = 0;
          nextFilelocksPtr->prev = 0;
          SVar2 = SHMGetInfo(SIID_FILE_LOCKS);
          nextFilelocksPtr->next = SVar2;
          nextFilelocksPtr->refCount = 1;
          nextFilelocksPtr->share_mode = 0xffffffff;
          nextFilelocksPtr->nbReadAccess = 0;
          nextFilelocksPtr->nbWriteAccess = 0;
          if (nextFilelocksPtr->next == 0) {
            unix_filename = (char *)0x0;
            bVar3 = true;
          }
          else {
            unix_filename = (char *)SHMPtrToPtr(nextFilelocksPtr->next);
            bVar3 = unix_filename != (char *)0x0;
          }
          if (bVar3) {
            if (unix_filename != (char *)0x0) {
              *(SHMFILELOCKS **)(unix_filename + 0x20) = filelocksPtr;
            }
            SHMSetInfo(SIID_FILE_LOCKS,(SHMPTR)filelocksPtr);
            goto LAB_00147274;
          }
          fprintf(_stderr,"] %s %s:%d","FILEGetSHMFileLocks",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
                  ,0x303);
          fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
          shmPtrRet._0_4_ = 0x54f;
          SHMfree(nextFilelocksPtr->unix_filename);
        }
      }
      else {
        fprintf(_stderr,"] %s %s:%d","FILEGetSHMFileLocks",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
                ,0x2ec);
        fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
        shmPtrRet._0_4_ = 0x54f;
      }
      SHMfree((SHMPTR)filelocksPtr);
      filelocksPtr = (SHMFILELOCKS *)0x0;
    }
  }
LAB_00147274:
  SHMRelease();
  if ((PAL_ERROR)shmPtrRet == 0) {
    *pshmFileLocks = (SHMPTR)filelocksPtr;
  }
  return (PAL_ERROR)shmPtrRet;
}

Assistant:

PAL_ERROR
FILEGetSHMFileLocks(
    LPCSTR filename,
    SHMPTR *pshmFileLocks,
    BOOL noCreate
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMPTR shmPtrRet = 0;
    SHMFILELOCKS *filelocksPtr, *nextFilelocksPtr;
    char *unix_filename;

    SHMLock();

    shmPtrRet = SHMGetInfo(SIID_FILE_LOCKS);

    while(shmPtrRet != 0)
    {        
        if ( (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, filelocksPtr, shmPtrRet) == FALSE) ||
             (SHMPTR_TO_TYPED_PTR_BOOL(char, unix_filename, filelocksPtr->unix_filename) == FALSE))
        {
            ASSERT("Unable to get pointer from shm pointer.\n");
            palError = ERROR_INTERNAL_ERROR;
            goto EXIT;
        }

        if (unix_filename == NULL)
        {
            ERROR("Unexpected lock file name value.\n");
            palError = ERROR_INTERNAL_ERROR;
            goto EXIT;
        }
        
        if (strcmp(unix_filename, filename) == 0)
        {
            filelocksPtr->refCount++;
            goto EXIT;
        }
        
        shmPtrRet = filelocksPtr->next;
    }

    /* the file has never been locked before.*/
    shmPtrRet = 0;
    if (noCreate)
    {
      goto EXIT;
    }

    TRACE("Create a new entry in the file lock list in SHM\n");

    /* Create a new entry in the file lock list in SHM */
    if ((shmPtrRet = SHMalloc(sizeof(SHMFILELOCKS))) == 0)
    {
        ERROR("Can't allocate SHMFILELOCKS structure\n");
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto EXIT;
    }

    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, filelocksPtr, shmPtrRet) == FALSE)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto CLEANUP1;
    }

    filelocksPtr->unix_filename = SHMStrDup(filename);
    if (filelocksPtr->unix_filename == 0)
    {
        ERROR("Can't allocate shared memory for filename\n");
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto CLEANUP1;
    }

    filelocksPtr->fileLockedRgns = 0;
    filelocksPtr->prev = 0;
    filelocksPtr->next = SHMGetInfo(SIID_FILE_LOCKS);
    filelocksPtr->refCount = 1;
    filelocksPtr->share_mode = SHARE_MODE_NOT_INITALIZED;
    filelocksPtr->nbReadAccess = 0;
    filelocksPtr->nbWriteAccess = 0;

    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, nextFilelocksPtr, filelocksPtr->next) == FALSE)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto CLEANUP2;
    }
    
    if (nextFilelocksPtr != NULL)
    {
        nextFilelocksPtr->prev = shmPtrRet;
    }

    SHMSetInfo(SIID_FILE_LOCKS, shmPtrRet);
    goto EXIT;

CLEANUP2:
    SHMfree(filelocksPtr->unix_filename);
CLEANUP1:
    SHMfree(shmPtrRet);
    shmPtrRet = 0;
EXIT:    
    SHMRelease();

    if (NO_ERROR == palError)
    {
        *pshmFileLocks = shmPtrRet;
    }
    
    return palError;
}